

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
setHessianBlockAndItsTranspose
          (MultipleShootingTranscription *this,MatrixDynSize *hessian,MatrixDynSize *block,
          size_t startRow,size_t startCol)

{
  bool bVar1;
  bool *pbVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  
  setHessianBlock(this,hessian,block,startRow,startCol);
  pbVar2 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startCol,startRow);
  bVar1 = *pbVar2;
  pdVar3 = (double *)iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar4 = iDynTree::MatrixDynSize::cols();
  lVar5 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar6 = iDynTree::MatrixDynSize::cols();
  lVar7 = iDynTree::MatrixDynSize::cols();
  lVar8 = iDynTree::MatrixDynSize::rows();
  lVar5 = lVar5 + (startRow & 0xffffffff) * 8 + lVar6 * startCol * 8;
  if (bVar1 == true) {
    if (0 < lVar7) {
      lVar9 = 0;
      do {
        if (0 < lVar8) {
          lVar11 = 0;
          pdVar10 = pdVar3;
          do {
            *(double *)(lVar5 + lVar11 * 8) = *pdVar10 + *(double *)(lVar5 + lVar11 * 8);
            lVar11 = lVar11 + 1;
            pdVar10 = pdVar10 + lVar4;
          } while (lVar8 != lVar11);
        }
        lVar9 = lVar9 + 1;
        pdVar3 = pdVar3 + 1;
        lVar5 = lVar5 + lVar6 * 8;
      } while (lVar9 != lVar7);
    }
  }
  else {
    if (0 < lVar7) {
      lVar9 = 0;
      do {
        if (0 < lVar8) {
          lVar11 = 0;
          pdVar10 = pdVar3;
          do {
            *(double *)(lVar5 + lVar11 * 8) = *pdVar10;
            lVar11 = lVar11 + 1;
            pdVar10 = pdVar10 + lVar4;
          } while (lVar8 != lVar11);
        }
        lVar9 = lVar9 + 1;
        pdVar3 = pdVar3 + 1;
        lVar5 = lVar5 + lVar6 * 8;
      } while (lVar9 != lVar7);
    }
    pbVar2 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startCol,startRow);
    *pbVar2 = true;
  }
  return;
}

Assistant:

void setHessianBlockAndItsTranspose(MatrixDynSize& hessian, const MatrixDynSize& block, size_t startRow, size_t startCol) {
                setHessianBlock(hessian, block, startRow, startCol);

                if (m_hessianBlocks(startCol, startRow)) {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startCol), static_cast<unsigned int>(startRow), block.cols(), block.rows()) += toEigen(block).transpose();
                } else {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startCol), static_cast<unsigned int>(startRow), block.cols(), block.rows()) = toEigen(block).transpose();
                    m_hessianBlocks(startCol, startRow) = true;
                }
            }